

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# home.cpp
# Opt level: O0

string * fs_get_username_abi_cxx11_(void)

{
  char *__s;
  string *in_RDI;
  allocator<char> local_19;
  passwd *local_18;
  passwd *pw;
  
  local_18 = fs_getpwuid();
  if (local_18 == (passwd *)0x0) {
    fs_print_error("","fs_get_username");
    std::__cxx11::string::string((string *)in_RDI);
  }
  else {
    __s = local_18->pw_name;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)in_RDI,__s,&local_19);
    std::allocator<char>::~allocator(&local_19);
  }
  return in_RDI;
}

Assistant:

std::string fs_get_username()
{
  // Get username of the current user

#if defined(_WIN32)

// https://learn.microsoft.com/en-us/windows/win32/api/secext/nf-secext-getusernameexa
  std::string name(fs_get_max_path(), '\0');
  ULONG L = static_cast<ULONG>(name.size());
// https://learn.microsoft.com/en-us/windows/win32/api/secext/ne-secext-extended_name_format
  if(GetUserNameExA(NameSamCompatible, name.data(), &L) != 0){
    name.resize(L);
    return name;
  }

#else

  if (auto pw = fs_getpwuid())
    return pw->pw_name;

#endif

  fs_print_error("", __func__);
  return {};
}